

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateBinary(OptimizeInstructions *this,Binary *outer)

{
  BinaryOp BVar1;
  Type type;
  bool bVar2;
  BinaryOp BVar3;
  Expression *pEVar4;
  OptimizeInstructions *pOVar5;
  Expression *pEVar6;
  EffectAnalyzer local_198;
  OptimizeInstructions *local_38;
  
  type.id = (outer->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((type.id & 0xfffffffffffffffe) != 2) {
    return (Expression *)0x0;
  }
  pEVar4 = (Expression *)0x0;
  if (outer->right->_id == BinaryId) {
    pEVar4 = outer->right;
  }
  if ((pEVar4 == (Expression *)0x0) || (outer->op != *(BinaryOp *)(pEVar4 + 1))) {
LAB_009ebf76:
    bVar2 = true;
    local_38 = this;
  }
  else {
    local_38 = this;
    EffectAnalyzer::EffectAnalyzer
              (&local_198,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,outer->left);
    bVar2 = true;
    if (local_198.trap == false) {
      bVar2 = EffectAnalyzer::hasNonTrapSideEffects(&local_198);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_198.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_198.localsRead._M_t);
    this = local_38;
    if (bVar2 != false) goto LAB_009ebf76;
    bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar4[1].type.id,outer->left);
    if (bVar2) {
      if (6 < type.id) {
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x1c4,"BasicType wasm::Type::getBasic() const");
      }
      BVar1 = outer->op;
      if ((BVar1 == *(BinaryOp *)(&DAT_00e16570 + type.id * 4)) ||
         (BVar3 = Abstract::getBinary(type,Xor), BVar1 == BVar3)) {
        pEVar4 = *(Expression **)(pEVar4 + 2);
        goto LAB_009ebead;
      }
      BVar1 = outer->op;
      BVar3 = Abstract::getBinary(type,And);
      if (BVar1 == BVar3) goto LAB_009ebead;
      BVar1 = outer->op;
      BVar3 = Abstract::getBinary(type,Or);
      this = local_38;
      if (BVar1 != BVar3) goto LAB_009ebeec;
LAB_009ebf72:
      bVar2 = false;
    }
    else {
LAB_009ebeec:
      bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar4 + 2),outer->left);
      if ((!bVar2) ||
         (bVar2 = EffectAnalyzer::canReorder
                            (&((this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).super_Pass.runner)->options,
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currModule,outer->left,(Expression *)pEVar4[1].type.id), !bVar2))
      goto LAB_009ebf76;
      BVar1 = outer->op;
      BVar3 = Abstract::getBinary(type,Xor);
      if (BVar1 == BVar3) {
        pEVar4 = (Expression *)pEVar4[1].type.id;
      }
      else {
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,And);
        if (BVar1 != BVar3) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,Or);
          this = local_38;
          if (BVar1 == BVar3) goto LAB_009ebf72;
          goto LAB_009ebf76;
        }
      }
LAB_009ebead:
      bVar2 = false;
    }
  }
  if (!bVar2) {
    return pEVar4;
  }
  pEVar6 = (Expression *)0x0;
  if (outer->left->_id == BinaryId) {
    pEVar6 = outer->left;
  }
  if ((pEVar6 != (Expression *)0x0) && (outer->op == *(BinaryOp *)(pEVar6 + 1))) {
    EffectAnalyzer::EffectAnalyzer
              (&local_198,
               &((local_38->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (local_38->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,outer->right);
    bVar2 = true;
    if (local_198.trap == false) {
      bVar2 = EffectAnalyzer::hasNonTrapSideEffects(&local_198);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_198.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_198.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_198.localsRead._M_t);
    pOVar5 = local_38;
    if (bVar2 == false) {
      bVar2 = ExpressionAnalyzer::equal(*(Expression **)(pEVar6 + 2),outer->right);
      if (bVar2) {
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,Xor);
        if (BVar1 != BVar3) {
          BVar1 = outer->op;
          BVar3 = Abstract::getBinary(type,RemS);
          if ((((BVar1 != BVar3) &&
               (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,RemU), BVar1 != BVar3)) &&
              (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,And), BVar1 != BVar3)) &&
             (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,Or), pOVar5 = local_38,
             BVar1 != BVar3)) goto LAB_009ec0d7;
LAB_009ec154:
          bVar2 = false;
          pEVar4 = pEVar6;
          goto LAB_009ec15d;
        }
        pEVar4 = (Expression *)pEVar6[1].type.id;
LAB_009ec124:
        bVar2 = false;
        goto LAB_009ec15d;
      }
LAB_009ec0d7:
      bVar2 = ExpressionAnalyzer::equal((Expression *)pEVar6[1].type.id,outer->right);
      if ((bVar2) &&
         (bVar2 = EffectAnalyzer::canReorder
                            (&((pOVar5->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).super_Pass.runner)->options,
                             (pOVar5->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).
                             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .
                             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             .currModule,(Expression *)pEVar6[1].type.id,
                             *(Expression **)(pEVar6 + 2)), bVar2)) {
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,Xor);
        if (BVar1 == BVar3) {
          pEVar4 = *(Expression **)(pEVar6 + 2);
          goto LAB_009ec124;
        }
        BVar1 = outer->op;
        BVar3 = Abstract::getBinary(type,And);
        if ((BVar1 == BVar3) ||
           (BVar1 = outer->op, BVar3 = Abstract::getBinary(type,Or), BVar1 == BVar3))
        goto LAB_009ec154;
      }
    }
  }
  bVar2 = true;
LAB_009ec15d:
  if (bVar2) {
    return (Expression *)0x0;
  }
  return pEVar4;
}

Assistant:

Expression* deduplicateBinary(Binary* outer) {
    Type type = outer->type;
    if (type.isInteger()) {
      if (auto* inner = outer->right->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->left)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->left, outer->left)) {
              // x - (x - y)  ==>   y
              // x ^ (x ^ y)  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Sub) ||
                  outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // x & (x & y)  ==>   x & y
              // x | (x | y)  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            if (ExpressionAnalyzer::equal(inner->right, outer->left) &&
                canReorder(outer->left, inner->left)) {
              // x ^ (y ^ x)  ==>   y
              // (note that we need the check for reordering here because if
              // e.g. y writes to a local that x reads, the second appearance
              // of x would be different from the first)
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }

              // x & (y & x)  ==>   y & x
              // x | (y | x)  ==>   y | x
              // (here we need the check for reordering for the more obvious
              // reason that previously x appeared before y, and now y appears
              // first; or, if we tried to emit x [&|] y here, reversing the
              // order, we'd be in the same situation as the previous comment)
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
      if (auto* inner = outer->left->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->right)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->right, outer->right)) {
              // (x ^ y) ^ y  ==>   x
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }
              // (x % y) % y  ==>   x % y
              // (x & y) & y  ==>   x & y
              // (x | y) | y  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::RemS) ||
                  outer->op == Abstract::getBinary(type, Abstract::RemU) ||
                  outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            // See comments in the parallel code earlier about ordering here.
            if (ExpressionAnalyzer::equal(inner->left, outer->right) &&
                canReorder(inner->left, inner->right)) {
              // (x ^ y) ^ x  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // (x & y) & x  ==>   x & y
              // (x | y) | x  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
    }
    return nullptr;
  }